

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O2

int __thiscall
sqvector<long_long>::copy(sqvector<long_long> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  longlong *plVar1;
  long lVar2;
  longlong in_RAX;
  SQUnsignedInteger i;
  ulong uVar3;
  longlong local_18;
  
  local_18 = in_RAX;
  if (this->_size != 0) {
    local_18 = 0;
    resize(this,0,&local_18);
  }
  if (this->_allocated < *(ulong *)(dst + 8)) {
    _realloc(this,*(ulong *)(dst + 8));
  }
  plVar1 = this->_vals;
  lVar2 = *(long *)dst;
  for (uVar3 = 0; uVar3 < *(ulong *)(dst + 8); uVar3 = uVar3 + 1) {
    plVar1[uVar3] = *(longlong *)(lVar2 + uVar3 * 8);
  }
  this->_size = *(ulong *)(dst + 8);
  return (int)plVar1;
}

Assistant:

void copy(const sqvector<T>& v)
    {
        if(_size) {
            resize(0); //destroys all previous stuff
        }
        //resize(v._size);
        if(v._size > _allocated) {
            _realloc(v._size);
        }
        for(SQUnsignedInteger i = 0; i < v._size; i++) {
            new ((void *)&_vals[i]) T(v._vals[i]);
        }
        _size = v._size;
    }